

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer3.cpp
# Opt level: O2

KBOOL __thiscall KDIS::DATA_TYPE::IFF_Layer3::operator==(IFF_Layer3 *this,IFF_Layer3 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  
  KVar1 = LayerHeader::operator!=(&this->super_LayerHeader,&Value->super_LayerHeader);
  if ((!KVar1) &&
     (KVar1 = SimulationIdentifier::operator!=(&this->m_RptSim,&Value->m_RptSim), !KVar1)) {
    bVar2 = std::operator!=(&this->m_vStdVarRecs,&Value->m_vStdVarRecs);
    return !bVar2;
  }
  return false;
}

Assistant:

KBOOL IFF_Layer3::operator == ( const IFF_Layer3 & Value ) const
{
    if( LayerHeader::operator !=( Value ) )            return false;    
    if( m_RptSim              != Value.m_RptSim )      return false;
    if( m_vStdVarRecs         != Value.m_vStdVarRecs ) return false;
    return true;
}